

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O3

void helper_phsubw_mmx_x86_64(CPUX86State *env,MMXReg *d,MMXReg *s)

{
  d->_w_MMXReg[0] = d->_w_MMXReg[0] - d->_w_MMXReg[1];
  d->_w_MMXReg[1] = d->_w_MMXReg[2] - d->_w_MMXReg[3];
  d->_w_MMXReg[2] = s->_w_MMXReg[0] - s->_w_MMXReg[1];
  d->_w_MMXReg[3] = s->_w_MMXReg[2] - s->_w_MMXReg[3];
  return;
}

Assistant:

void glue(helper_phsubw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    d->W(0) = (int16_t)d->W(0) - (int16_t)d->W(1);
    d->W(1) = (int16_t)d->W(2) - (int16_t)d->W(3);
    XMM_ONLY(d->W(2) = (int16_t)d->W(4) - (int16_t)d->W(5));
    XMM_ONLY(d->W(3) = (int16_t)d->W(6) - (int16_t)d->W(7));
    d->W((2 << SHIFT) + 0) = (int16_t)s->W(0) - (int16_t)s->W(1);
    d->W((2 << SHIFT) + 1) = (int16_t)s->W(2) - (int16_t)s->W(3);
    XMM_ONLY(d->W(6) = (int16_t)s->W(4) - (int16_t)s->W(5));
    XMM_ONLY(d->W(7) = (int16_t)s->W(6) - (int16_t)s->W(7));
}